

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9SaveAig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  bool bVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  while (iVar3 = Extra_UtilGetopt(argc,argv,"ah"), iVar3 == 0x61) {
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (iVar3 == -1) {
    pGVar4 = pAbc->pGia;
    if (pGVar4 != (Gia_Man_t *)0x0) {
      if (((bVar2) && (pGVar1 = pAbc->pGiaSaved, pGVar1 != (Gia_Man_t *)0x0)) &&
         ((pGVar4->vCis->nSize - pGVar4->nObjs) + pGVar4->vCos->nSize <=
          (pGVar1->vCis->nSize - pGVar1->nObjs) + pGVar1->vCos->nSize)) {
        return 0;
      }
      Gia_ManStopP(&pAbc->pGiaSaved);
      pGVar4 = Gia_ManDupWithAttributes(pAbc->pGia);
      pAbc->pGiaSaved = pGVar4;
      return 0;
    }
    pcVar5 = "Empty network.\n";
    iVar3 = -1;
  }
  else {
    Abc_Print(-2,"usage: &saveaig [-ah]\n");
    Abc_Print(-2,"\t        saves the current AIG into the internal storage\n");
    pcVar5 = "yes";
    if (!bVar2) {
      pcVar5 = "no";
    }
    Abc_Print(-2,"\t-a    : toggle saving AIG with the smaller area [default = %s]\n",pcVar5);
    pcVar5 = "\t-h    : print the command usage\n";
    iVar3 = -2;
  }
  Abc_Print(iVar3,pcVar5);
  return 1;
}

Assistant:

int Abc_CommandAbc9SaveAig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fArea = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ah" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fArea ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( fArea && pAbc->pGiaSaved != NULL && Gia_ManAndNum(pAbc->pGiaSaved) <= Gia_ManAndNum(pAbc->pGia) )
        return 0;
    // save the design as best
    Gia_ManStopP( &pAbc->pGiaSaved );
    pAbc->pGiaSaved = Gia_ManDupWithAttributes( pAbc->pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: &saveaig [-ah]\n" );
    Abc_Print( -2, "\t        saves the current AIG into the internal storage\n" );
    Abc_Print( -2, "\t-a    : toggle saving AIG with the smaller area [default = %s]\n", fArea? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}